

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::getCountersValues
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *counterValues,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *values,int ndx,int counterCount)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  int local_28;
  value_type_conflict2 local_24;
  int valueNdx;
  int local_1c;
  int counterCount_local;
  int ndx_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *values_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *counterValues_local;
  
  valueNdx = counterCount;
  local_1c = ndx;
  _counterCount_local = values;
  values_local = counterValues;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(values);
  local_24 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (counterValues,sVar2 / (ulong)(long)valueNdx,&local_24);
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(values_local);
    if ((int)sVar2 <= local_28) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_counterCount_local,(long)(local_28 * valueNdx + local_1c));
    vVar1 = *pvVar3;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (values_local,(long)local_28);
    *pvVar4 = vVar1;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void AtomicCounterTest::getCountersValues (vector<deUint32>& counterValues, const vector<deUint32>& values, int ndx, int counterCount)
{
	counterValues.resize(values.size()/counterCount, 0);

	DE_ASSERT(values.size() % counterCount == 0);

	for (int valueNdx = 0; valueNdx < (int)counterValues.size(); valueNdx++)
		counterValues[valueNdx] = values[valueNdx * counterCount + ndx];
}